

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

Serializer * __thiscall cfd::core::Serializer::operator<<(Serializer *this,int64_t number)

{
  int64_t number_local;
  Serializer *this_local;
  
  AddDirectNumber(this,number);
  return this;
}

Assistant:

Serializer& Serializer::operator<<(int64_t number) {
  AddDirectNumber(number);
  return *this;
}